

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O2

_Bool borg_flow_take(_Bool viewable,wchar_t nearness)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  borg_take *pbVar6;
  _Bool _Var7;
  wchar_t wVar8;
  wchar_t wVar9;
  loc_conflict grid2;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  wchar_t wVar14;
  long lVar15;
  
  uVar3 = z_info->quiver_slot_size;
  iVar5 = (uVar3 - 2) + (uint)uVar3;
  if (borg.trait[0x35] == 0) {
    iVar5 = uVar3 - 1;
  }
  if ((((borg_takes_cnt != 0) &&
       (borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty == '\0')) &&
      (!scaryguy_on_level)) && ((borg.trait[0x1a] != 0 && (!borg_morgoth_position)))) {
    iVar12 = borg.trait[0x23];
    borg_temp_n = 0;
    uVar13 = 0xffffffffffffffff;
    wVar14 = L'\xffffffff';
    for (uVar11 = 0; (long)uVar11 < (long)track_less.num; uVar11 = uVar11 + 1) {
      grid2 = loc(track_less.x[uVar11],track_less.y[uVar11]);
      wVar8 = distance(borg.c,grid2);
      if (wVar14 < wVar8) {
        uVar13 = uVar11;
      }
      uVar13 = uVar13 & 0xffffffff;
      if (wVar14 <= wVar8) {
        wVar14 = wVar8;
      }
    }
    wVar8 = iVar12 * 3 + L'\t';
    if (0x13 < iVar12) {
      wVar8 = L'ú';
    }
    iVar12 = (int)uVar13;
    lVar10 = 0x18;
    for (lVar15 = 1; pbVar6 = borg_takes, lVar15 < borg_takes_nxt; lVar15 = lVar15 + 1) {
      if (*(long *)((long)&borg_takes->kind + lVar10) != 0) {
        bVar1 = (&borg_takes->x)[lVar10];
        bVar2 = (&borg_takes->y)[lVar10];
        if (((int)uVar13 != -1) && (borg.trait[0x23] < 10)) {
          uVar13 = uVar13 & 0xffffffff;
          wVar9 = borg_distance(track_less.y[iVar12],track_less.x[iVar12],(uint)bVar2,(uint)bVar1);
          if ((wVar14 <= wVar8) && (wVar8 <= wVar9)) goto LAB_0020db52;
        }
        if ((((0 < *(int *)((long)&pbVar6->value + lVar10)) &&
             (((!viewable || ((borg_grids[bVar2][bVar1].info & 0x20) != 0)) &&
              ((iVar4 = *(int *)((long)&pbVar6->tval + lVar10), iVar4 != borg.trait[0x98] ||
               (borg.trait[0x9b] < iVar5)))))) &&
            (((borg.trait[0x2d] < 500000 || (borg_cfg[0x18] != 0)) ||
             ((iVar4 != 0x23 &&
              (((_Var7 = tval_is_book_k(k_info + *(uint *)(*(long *)((long)&pbVar6->kind + lVar10) +
                                                          0x20)), !_Var7 ||
                (_Var7 = obj_kind_can_browse(k_info + *(uint *)(*(long *)((long)&pbVar6->kind +
                                                                         lVar10) + 0x20)), _Var7))
               && ((iVar4 = *(int *)((long)&pbVar6->tval + lVar10), 2 < iVar4 - 2U ||
                   (iVar4 == borg.trait[0x98])))))))))) &&
           (((borg_flow_clear(), nearness < L'\x06' || (0x13 < borg.trait[0x23])) ||
            (wVar9 = borg_flow_cost_stair((uint)bVar2,(uint)bVar1,(int)uVar13), wVar9 <= wVar8)))) {
          borg_temp_x[borg_temp_n] = bVar1;
          borg_temp_y[borg_temp_n] = bVar2;
          borg_temp_n = borg_temp_n + 1;
        }
      }
LAB_0020db52:
      lVar10 = lVar10 + 0x18;
    }
    if (borg_temp_n != 0) {
      borg_flow_clear();
      for (lVar15 = 0; lVar15 < borg_temp_n; lVar15 = lVar15 + 1) {
        borg_flow_enqueue_grid((uint)borg_temp_y[lVar15],(uint)borg_temp_x[lVar15]);
      }
      borg_flow_spread(nearness,true,!viewable,false,L'\xffffffff',false);
      _Var7 = borg_flow_commit("item",L'\x02');
      if (_Var7) {
        _Var7 = borg_flow_old(L'\x02');
        return _Var7;
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_take(bool viewable, int nearness)
{
    int i, x, y;
    int b_stair = -1, j, b_j = -1;
    int leash = borg.trait[BI_CLEVEL] * 3 + 9;
    int full_quiver;

    borg_grid *ag;

    /* Missile carry limit */
    /* allow shooters to two quiver slots full */
    if (borg.trait[BI_FAST_SHOTS])
        full_quiver = (z_info->quiver_slot_size - 1) * 2;
    else
        full_quiver = z_info->quiver_slot_size - 1;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* If ScaryGuy, no chasing down items */
    if (scaryguy_on_level)
        return false;

    /* If out of fuel, don't mess around */
    if (!borg.trait[BI_LIGHT])
        return false;

    /* Not if sitting in a sea of runes */
    if (borg_morgoth_position)
        return false;

    /* increase leash */
    if (borg.trait[BI_CLEVEL] >= 20)
        leash = 250;

    /* Starting over on count */
    borg_temp_n = 0;

    /* Check distance away from stairs, used later */
    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the object list */
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take *take = &borg_takes[i];

        /* Skip dead objects */
        if (!take->kind)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* Skip ones that make me wander too far */
        if (b_stair != -1 && borg.trait[BI_CLEVEL] < 10) {
            /* Check the distance of this 'take' to the stair */
            j = borg_distance(
                track_less.y[b_stair], track_less.x[b_stair], y, x);
            /* skip far away takes while I am close to stair*/
            if (b_j <= leash && j >= leash)
                continue;
        }

        /* skip worthless items */
        if (take->value <= 0)
            continue;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* Don't bother with ammo if I am at capacity */

        if (take->tval == borg.trait[BI_AMMO_TVAL]
            && borg.trait[BI_AMISSILES] >= full_quiver)
            continue;
        /* No need to chase certain things down after a certain amount.  Don't
         * chase: Money Other spell books Wrong ammo
         */
        if (borg.trait[BI_GOLD] >= 500000
            && borg_cfg[BORG_MONEY_SCUM_AMOUNT] == 0) {
            if (take->tval == TV_GOLD)
                continue;
            if (tval_is_book_k(&k_info[take->kind->kidx])
                && !obj_kind_can_browse(&k_info[take->kind->kidx]))
                continue;
            if ((take->tval == TV_SHOT || take->tval == TV_ARROW
                    || take->tval == TV_BOLT)
                && take->tval != borg.trait[BI_AMMO_TVAL])
                continue;
            /*
            Restore Mana for warriors?
            low level potions
            low level scrolls
            */
        }

        /* Clear the flow codes */
        borg_flow_clear();


        /* Check the distance to stair for this proposed grid and leash*/
        if (nearness > 5 && borg.trait[BI_CLEVEL] < 20
            && borg_flow_cost_stair(y, x, b_stair) > leash)
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unkown squares.  This was for performance. */
    borg_flow_spread(nearness, true, !viewable, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("item", GOAL_TAKE))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}